

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::SwapFieldHelper::SwapArenaStringPtr
               (ArenaStringPtr *lhs,Arena *lhs_arena,ArenaStringPtr *rhs,Arena *rhs_arena)

{
  void *pvVar1;
  void *pvVar2;
  undefined8 *puVar3;
  string *value;
  string temp;
  string local_40;
  
  if (lhs_arena == rhs_arena) {
    puVar3 = (undefined8 *)(rhs->tagged_ptr_).ptr_;
    (rhs->tagged_ptr_).ptr_ = (lhs->tagged_ptr_).ptr_;
  }
  else {
    pvVar1 = (lhs->tagged_ptr_).ptr_;
    pvVar2 = (rhs->tagged_ptr_).ptr_;
    if (((ulong)pvVar1 & 3) == 0) {
      if (((ulong)pvVar2 & 3) == 0) {
        return;
      }
      ArenaStringPtr::Set<>(lhs,(string *)((ulong)pvVar2 & 0xfffffffffffffffc),lhs_arena);
      ArenaStringPtr::Destroy(rhs);
      (rhs->tagged_ptr_).ptr_ = &fixed_address_empty_string_abi_cxx11_;
      return;
    }
    value = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
    if (((ulong)pvVar2 & 3) != 0) {
      std::__cxx11::string::string((string *)&local_40,(string *)value);
      ArenaStringPtr::Set<>
                (lhs,(string *)((ulong)(rhs->tagged_ptr_).ptr_ & 0xfffffffffffffffc),lhs_arena);
      ArenaStringPtr::Set(rhs,&local_40,rhs_arena);
      std::__cxx11::string::~string((string *)&local_40);
      return;
    }
    ArenaStringPtr::Set<>(rhs,value,rhs_arena);
    ArenaStringPtr::Destroy(lhs);
    puVar3 = &fixed_address_empty_string_abi_cxx11_;
  }
  (lhs->tagged_ptr_).ptr_ = puVar3;
  return;
}

Assistant:

void SwapFieldHelper::SwapArenaStringPtr(ArenaStringPtr* lhs, Arena* lhs_arena,
                                         ArenaStringPtr* rhs,
                                         Arena* rhs_arena) {
  if (lhs_arena == rhs_arena) {
    ArenaStringPtr::InternalSwap(lhs, rhs, lhs_arena);
  } else if (lhs->IsDefault() && rhs->IsDefault()) {
    // Nothing to do.
  } else if (lhs->IsDefault()) {
    lhs->Set(rhs->Get(), lhs_arena);
    // rhs needs to be destroyed before overwritten.
    rhs->Destroy();
    rhs->InitDefault();
  } else if (rhs->IsDefault()) {
    rhs->Set(lhs->Get(), rhs_arena);
    // lhs needs to be destroyed before overwritten.
    lhs->Destroy();
    lhs->InitDefault();
  } else {
    std::string temp = lhs->Get();
    lhs->Set(rhs->Get(), lhs_arena);
    rhs->Set(std::move(temp), rhs_arena);
  }
}